

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O2

bool sptk::GaussianMixtureModeling::CalculateLogProbability
               (int num_order,int num_mixture,bool is_diagonal,bool check_size,
               vector<double,_std::allocator<double>_> *input_vector,
               vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *mean_vectors,
               vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
               *covariance_matrices,
               vector<double,_std::allocator<double>_> *components_of_log_probability,
               double *log_probability,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *this_00;
  pointer pdVar1;
  ulong __new_size;
  bool bVar2;
  int l_1;
  double *pdVar3;
  uint length;
  int l_2;
  long lVar4;
  pointer pdVar5;
  ulong uVar6;
  long lVar7;
  int l;
  int column;
  size_type __new_size_00;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  vector<double,_std::allocator<double>_> diag;
  SymmetricMatrix tmp;
  double local_f0;
  _Vector_base<double,_std::allocator<double>_> local_98;
  ulong local_78;
  undefined1 local_70 [16];
  int local_60;
  
  if (-1 < num_mixture) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    length = num_order + 1;
    lVar7 = (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    __new_size_00 = lVar7 >> 3;
    if (__new_size_00 != (long)(int)length) {
      return false;
    }
    __new_size = (ulong)(uint)num_mixture;
    if ((!check_size) ||
       (bVar2 = anon_unknown.dwarf_170d7::CheckGmm
                          (num_mixture,length,weights,mean_vectors,covariance_matrices), bVar2)) {
      if ((components_of_log_probability != (vector<double,_std::allocator<double>_> *)0x0) &&
         ((long)(components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>)
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>)
                ._M_impl.super__Vector_impl_data._M_start >> 3 != __new_size)) {
        std::vector<double,_std::allocator<double>_>::resize
                  (components_of_log_probability,__new_size);
      }
      if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != lVar7) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size_00);
      }
      this = &buffer->gconsts_;
      if ((long)(buffer->gconsts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->gconsts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this,__new_size);
      }
      this_00 = &buffer->precisions_;
      if ((long)(buffer->precisions_).
                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->precisions_).
                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>.
                _M_impl.super__Vector_impl_data._M_start >> 6 != __new_size) {
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::resize
                  (this_00,__new_size);
      }
      if (buffer->precomputed_ != true) {
        dVar10 = (double)(int)length * 1.8378770664093453;
        for (uVar6 = 0; uVar6 != __new_size; uVar6 = uVar6 + 1) {
          if (is_diagonal) {
            dVar11 = 0.0;
            for (column = 0; column <= num_order; column = column + 1) {
              local_70._8_8_ =
                   (covariance_matrices->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar6;
              local_70._0_8_ = &PTR__Row_00119b58;
              local_60 = column;
              pdVar3 = SymmetricMatrix::Row::operator[]((Row *)local_70,column);
              dVar12 = log(*pdVar3);
              dVar11 = dVar11 + dVar12;
            }
            dVar11 = dVar11 + dVar10;
          }
          else {
            SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_70,0);
            local_98._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
            local_98._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
            local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar2 = SymmetricMatrix::CholeskyDecomposition
                              ((covariance_matrices->
                               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                               )._M_impl.super__Vector_impl_data._M_start + uVar6,
                               (SymmetricMatrix *)local_70,
                               (vector<double,_std::allocator<double>_> *)&local_98);
            pdVar1 = local_98._M_impl.super__Vector_impl_data._M_finish;
            dVar11 = dVar10;
            if (bVar2) {
              dVar11 = 0.0;
              for (pdVar5 = local_98._M_impl.super__Vector_impl_data._M_start; pdVar5 != pdVar1;
                  pdVar5 = pdVar5 + 1) {
                dVar12 = log(*pdVar5);
                dVar11 = dVar11 + dVar12;
              }
              dVar11 = dVar11 + 0.0 + dVar10;
            }
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
            SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_70);
            if (!bVar2) {
              return false;
            }
          }
          (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] = dVar11;
        }
        if (!is_diagonal) {
          lVar7 = 0;
          while (__new_size * 0x40 + 0x40 != lVar7 + 0x40) {
            bVar2 = SymmetricMatrix::Invert
                              ((SymmetricMatrix *)
                               ((long)&((covariance_matrices->
                                        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                       _vptr_SymmetricMatrix + lVar7),
                               (SymmetricMatrix *)
                               ((long)&((this_00->
                                        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                       _vptr_SymmetricMatrix + lVar7));
            lVar7 = lVar7 + 0x40;
            if (!bVar2) {
              return false;
            }
          }
        }
        buffer->precomputed_ = true;
      }
      pdVar1 = (input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)num_order;
      dVar10 = -10000000000.0;
      for (uVar6 = 0; uVar6 != __new_size; uVar6 = uVar6 + 1) {
        local_f0 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar6];
        lVar4 = *(long *)&(mean_vectors->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar6].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        local_78 = uVar6;
        if (is_diagonal) {
          for (lVar8 = 0; lVar8 <= lVar7; lVar8 = lVar8 + 1) {
            dVar11 = pdVar1[lVar8] - *(double *)(lVar4 + lVar8 * 8);
            local_70._8_8_ =
                 (covariance_matrices->
                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
                 _M_impl.super__Vector_impl_data._M_start + uVar6;
            local_70._0_8_ = &PTR__Row_00119b58;
            local_60 = (int)lVar8;
            pdVar3 = SymmetricMatrix::Row::operator[]((Row *)local_70,local_60);
            local_f0 = local_f0 + (dVar11 * dVar11) / *pdVar3;
          }
        }
        else {
          pdVar5 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar8 = 0; lVar8 <= lVar7; lVar8 = lVar8 + 1) {
            pdVar5[lVar8] = pdVar1[lVar8] - *(double *)(lVar4 + lVar8 * 8);
          }
          for (lVar4 = 0; lVar4 <= lVar7; lVar4 = lVar4 + 1) {
            dVar11 = 0.0;
            for (uVar9 = 0; length != uVar9; uVar9 = uVar9 + 1) {
              dVar12 = pdVar5[uVar9];
              local_70._8_8_ =
                   (this_00->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar6;
              local_70._0_8_ = &PTR__Row_00119b58;
              local_60 = (int)lVar4;
              pdVar3 = SymmetricMatrix::Row::operator[]((Row *)local_70,(int)uVar9);
              dVar11 = dVar11 + dVar12 * *pdVar3;
            }
            local_f0 = local_f0 + dVar11 * pdVar5[lVar4];
          }
        }
        uVar6 = local_78;
        dVar11 = log((weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[local_78]);
        dVar11 = local_f0 * -0.5 + dVar11;
        if (components_of_log_probability != (vector<double,_std::allocator<double>_> *)0x0) {
          (components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>).
          _M_impl.super__Vector_impl_data._M_start[uVar6] = dVar11;
        }
        dVar10 = AddInLogSpace(dVar10,dVar11);
      }
      if (log_probability != (double *)0x0) {
        *log_probability = dVar10;
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool GaussianMixtureModeling::CalculateLogProbability(
    int num_order, int num_mixture, bool is_diagonal, bool check_size,
    const std::vector<double>& input_vector, const std::vector<double>& weights,
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    std::vector<double>* components_of_log_probability, double* log_probability,
    GaussianMixtureModeling::Buffer* buffer) {
  // Check inputs.
  const int length(num_order + 1);
  if (num_mixture < 0 ||
      input_vector.size() != static_cast<std::size_t>(length) ||
      NULL == buffer) {
    return false;
  }

  // Check size of GMM.
  if (check_size && !CheckGmm(num_mixture, length, weights, mean_vectors,
                              covariance_matrices)) {
    return false;
  }

  // Prepare memories.
  if (components_of_log_probability &&
      components_of_log_probability->size() !=
          static_cast<std::size_t>(num_mixture)) {
    components_of_log_probability->resize(num_mixture);
  }
  if (buffer->d_.size() != static_cast<std::size_t>(length)) {
    buffer->d_.resize(length);
  }
  if (buffer->gconsts_.size() != static_cast<std::size_t>(num_mixture)) {
    buffer->gconsts_.resize(num_mixture);
  }
  if (buffer->precisions_.size() != static_cast<std::size_t>(num_mixture)) {
    buffer->precisions_.resize(num_mixture);
  }

  if (!buffer->precomputed_) {
    // Precompute constant of log likelihood without multiplying -0.5.
    for (int k(0); k < num_mixture; ++k) {
      double gconst(length * std::log(sptk::kTwoPi));
      double log_determinant(0.0);
      if (is_diagonal) {
        for (int l(0); l <= num_order; ++l) {
          log_determinant += std::log(covariance_matrices[k][l][l]);
        }
        gconst += log_determinant;
      } else {
        SymmetricMatrix tmp;
        std::vector<double> diag;
        if (!covariance_matrices[k].CholeskyDecomposition(&tmp, &diag)) {
          return false;
        }
        log_determinant += std::accumulate(
            diag.begin(), diag.end(), 0.0,
            [](double acc, double x) { return acc + std::log(x); });
        gconst += log_determinant;
      }
      buffer->gconsts_[k] = gconst;
    }

    // Precompute inverse of covariance matrix.
    if (!is_diagonal) {
      for (int k(0); k < num_mixture; ++k) {
        if (!covariance_matrices[k].Invert(&(buffer->precisions_[k]))) {
          return false;
        }
      }
    }

    buffer->precomputed_ = true;
  }

  const double* x(&(input_vector[0]));
  double total(sptk::kLogZero);

  // Compute log probability of data.
  for (int k(0); k < num_mixture; ++k) {
    double sum(buffer->gconsts_[k]);
    const double* mu(&(mean_vectors[k][0]));
    if (is_diagonal) {
      for (int l(0); l <= num_order; ++l) {
        const double diff(x[l] - mu[l]);
        sum += diff * diff / covariance_matrices[k][l][l];
      }
    } else {
      double* d(&(buffer->d_[0]));
      for (int l(0); l <= num_order; ++l) {
        d[l] = x[l] - mu[l];
      }
      for (int l(0); l <= num_order; ++l) {
        double tmp(0.0);
        for (int m(0); m <= num_order; ++m) {
          tmp += d[m] * buffer->precisions_[k][l][m];
        }
        sum += tmp * d[l];
      }
    }

    const double p(std::log(weights[k]) - 0.5 * sum);
    if (components_of_log_probability) {
      (*components_of_log_probability)[k] = p;
    }
    total = AddInLogSpace(total, p);
  }

  if (log_probability) {
    *log_probability = total;
  }

  return true;
}